

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# methods.cpp
# Opt level: O0

int __thiscall
opengv::relative_pose::OptimizeNonlinearFunctor1::operator()
          (OptimizeNonlinearFunctor1 *this,VectorXd *x,VectorXd *fvec)

{
  ulong uVar1;
  int iVar2;
  Scalar *pSVar3;
  size_t sVar4;
  Scalar *pSVar5;
  double *in_RDI;
  Scalar SVar6;
  Scalar SVar7;
  double factor;
  double reprojError2;
  double reprojError1;
  bearingVector_t f2;
  bearingVector_t f1;
  bearingVector_t reprojection2;
  bearingVector_t reprojection1;
  transformation_t inverseSolution;
  rotation_t directRotation;
  translation_t directTranslation;
  rotation_t cam2Rotation;
  translation_t cam2Offset;
  rotation_t cam1Rotation;
  translation_t cam1Offset;
  size_t i;
  Matrix<double,_4,_1,_0,_4,_1> p_hom;
  rotation_t rotation;
  cayley_t cayley;
  translation_t translation;
  EigenBase<Eigen::Block<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_3,_1,_false>_>
  *in_stack_fffffffffffff980;
  DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *this_00;
  RelativeAdapterBase *in_stack_fffffffffffff988;
  Indices *in_stack_fffffffffffff990;
  DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *in_stack_fffffffffffff998;
  MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_const_Eigen::Product<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0>_>_>
  *other;
  MatrixBase<Eigen::Transpose<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_> *in_stack_fffffffffffff9a0;
  MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *in_stack_fffffffffffff9a8;
  MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *in_stack_fffffffffffff9b0;
  MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *in_stack_fffffffffffff9d0;
  undefined1 local_5e8 [24];
  undefined1 local_5d0 [24];
  RealScalar local_5b8;
  RealScalar local_590;
  Product<Eigen::Matrix<double,_3,_4,_0,_3,_4>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>,_0> local_568;
  cayley_t *in_stack_fffffffffffffab0;
  size_t in_stack_fffffffffffffbf0;
  RelativeAdapterBase *in_stack_fffffffffffffbf8;
  undefined1 local_208 [72];
  undefined1 local_1c0 [24];
  undefined1 local_1a8 [72];
  undefined1 local_160 [24];
  ulong local_148;
  
  Eigen::DenseBase<Eigen::Matrix<double,-1,1,0,-1,1>>::block<3,1>
            (in_stack_fffffffffffff998,(Index)in_stack_fffffffffffff990,
             (Index)in_stack_fffffffffffff988);
  Eigen::Matrix<double,3,1,0,3,1>::
  Matrix<Eigen::Block<Eigen::Matrix<double,_1,1,0,_1,1>const,3,1,false>>
            ((Matrix<double,_3,_1,_0,_3,_1> *)in_stack_fffffffffffff988,in_stack_fffffffffffff980);
  Eigen::DenseBase<Eigen::Matrix<double,-1,1,0,-1,1>>::block<3,1>
            (in_stack_fffffffffffff998,(Index)in_stack_fffffffffffff990,
             (Index)in_stack_fffffffffffff988);
  Eigen::Matrix<double,3,1,0,3,1>::
  Matrix<Eigen::Block<Eigen::Matrix<double,_1,1,0,_1,1>const,3,1,false>>
            ((Matrix<double,_3,_1,_0,_3,_1> *)in_stack_fffffffffffff988,in_stack_fffffffffffff980);
  math::cayley2rot(in_stack_fffffffffffffab0);
  Eigen::Matrix<double,_4,_1,_0,_4,_1>::Matrix((Matrix<double,_4,_1,_0,_4,_1> *)0xc8e83a);
  pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_1>::operator[]
                     ((DenseCoeffsBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_1> *)
                      in_stack_fffffffffffff988,(Index)in_stack_fffffffffffff980);
  *pSVar3 = 1.0;
  local_148 = 0;
  while( true ) {
    uVar1 = local_148;
    iVar2 = (int)((ulong)in_stack_fffffffffffff988 >> 0x20);
    sVar4 = Indices::size((Indices *)in_RDI[2]);
    if (sVar4 <= uVar1) break;
    this_00 = (DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)in_RDI[1];
    iVar2 = Indices::operator[](in_stack_fffffffffffff990,iVar2);
    (**(code **)(*(long *)this_00 + 0x28))(local_160,this_00,(long)iVar2);
    in_stack_fffffffffffff988 = (RelativeAdapterBase *)in_RDI[1];
    iVar2 = Indices::operator[](in_stack_fffffffffffff990,
                                (int)((ulong)in_stack_fffffffffffff988 >> 0x20));
    (*in_stack_fffffffffffff988->_vptr_RelativeAdapterBase[6])
              (local_1a8,in_stack_fffffffffffff988,(long)iVar2);
    in_stack_fffffffffffff990 = (Indices *)in_RDI[1];
    iVar2 = Indices::operator[](in_stack_fffffffffffff990,
                                (int)((ulong)in_stack_fffffffffffff988 >> 0x20));
    (**(code **)(*(long *)in_stack_fffffffffffff990 + 0x38))
              (local_1c0,in_stack_fffffffffffff990,(long)iVar2);
    other = (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_const_Eigen::Product<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0>_>_>
             *)in_RDI[1];
    iVar2 = Indices::operator[](in_stack_fffffffffffff990,
                                (int)((ulong)in_stack_fffffffffffff988 >> 0x20));
    (**(code **)(*(long *)other + 0x40))(local_208,other,(long)iVar2);
    Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::transpose(this_00);
    Eigen::MatrixBase<Eigen::Matrix<double,3,1,0,3,1>>::operator-
              (in_stack_fffffffffffff9b0,in_stack_fffffffffffff9a8);
    Eigen::MatrixBase<Eigen::Matrix<double,3,3,0,3,3>>::operator*
              ((MatrixBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)in_stack_fffffffffffff988,
               (MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)this_00);
    Eigen::
    MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Matrix<double,3,1,0,3,1>const,Eigen::Matrix<double,3,1,0,3,1>const>>
    ::operator+((MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                 *)in_stack_fffffffffffff9b0,
                (MatrixBase<Eigen::Product<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0>_>
                 *)in_stack_fffffffffffff9a8);
    Eigen::MatrixBase<Eigen::Transpose<Eigen::Matrix<double,3,3,0,3,3>>>::operator*
              (in_stack_fffffffffffff9a0,other);
    Eigen::Matrix<double,3,1,0,3,1>::
    Matrix<Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,3,3,0,3,3>>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Matrix<double,3,1,0,3,1>const,Eigen::Matrix<double,3,1,0,3,1>const>const,Eigen::Product<Eigen::Matrix<double,3,3,0,3,3>,Eigen::Matrix<double,3,1,0,3,1>,0>const>,0>>
              ((Matrix<double,_3,_1,_0,_3,_1> *)in_stack_fffffffffffff988,
               (EigenBase<Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_const_Eigen::Product<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0>_>,_0>_>
                *)this_00);
    Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::transpose(this_00);
    Eigen::MatrixBase<Eigen::Transpose<Eigen::Matrix<double,3,3,0,3,3>>>::operator*
              ((MatrixBase<Eigen::Transpose<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_> *)
               in_stack_fffffffffffff988,
               (MatrixBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)this_00);
    Eigen::
    MatrixBase<Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,3,3,0,3,3>>,Eigen::Matrix<double,3,3,0,3,3>,0>>
    ::operator*((MatrixBase<Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>_>
                 *)other,(MatrixBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)
                         in_stack_fffffffffffff990);
    Eigen::Matrix<double,3,3,0,3,3>::
    Matrix<Eigen::Product<Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,3,3,0,3,3>>,Eigen::Matrix<double,3,3,0,3,3>,0>,Eigen::Matrix<double,3,3,0,3,3>,0>>
              ((Matrix<double,_3,_3,_0,_3,_3> *)in_stack_fffffffffffff988,
               (EigenBase<Eigen::Product<Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>_>
                *)this_00);
    RelativeAdapterBase::sett12(in_stack_fffffffffffff988,(translation_t *)this_00);
    RelativeAdapterBase::setR12(in_stack_fffffffffffff988,(rotation_t *)this_00);
    Eigen::Matrix<double,_3,_4,_0,_3,_4>::Matrix((Matrix<double,_3,_4,_0,_3,_4> *)0xc8eab5);
    Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::transpose(this_00);
    Eigen::DenseBase<Eigen::Matrix<double,3,4,0,3,4>>::block<3,3>
              ((DenseBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_> *)other,
               (Index)in_stack_fffffffffffff990,(Index)in_stack_fffffffffffff988);
    Eigen::Block<Eigen::Matrix<double,3,4,0,3,4>,3,3,false>::operator=
              ((Block<Eigen::Matrix<double,_3,_4,_0,_3,_4>,_3,_3,_false> *)in_stack_fffffffffffff988
               ,(DenseBase<Eigen::Transpose<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_> *)this_00);
    Eigen::DenseBase<Eigen::Matrix<double,3,4,0,3,4>>::block<3,3>
              ((DenseBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_> *)other,
               (Index)in_stack_fffffffffffff990,(Index)in_stack_fffffffffffff988);
    Eigen::DenseBase<Eigen::Block<Eigen::Matrix<double,_3,_4,_0,_3,_4>,_3,_3,_false>_>::operator-
              ((DenseBase<Eigen::Block<Eigen::Matrix<double,_3,_4,_0,_3,_4>,_3,_3,_false>_> *)
               in_stack_fffffffffffff9a0);
    Eigen::
    MatrixBase<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,Eigen::Block<Eigen::Matrix<double,3,4,0,3,4>,3,3,false>const>>
    ::operator*((MatrixBase<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,_const_Eigen::Block<Eigen::Matrix<double,_3,_4,_0,_3,_4>,_3,_3,_false>_>_>
                 *)in_stack_fffffffffffff9a0,
                (MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)other);
    Eigen::DenseBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>::col
              ((DenseBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_> *)other,
               (Index)in_stack_fffffffffffff990);
    Eigen::Block<Eigen::Matrix<double,3,4,0,3,4>,3,1,true>::operator=
              ((Block<Eigen::Matrix<double,_3,_4,_0,_3,_4>,_3,_1,_true> *)in_stack_fffffffffffff988,
               (DenseBase<Eigen::Product<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,_const_Eigen::Block<Eigen::Matrix<double,_3,_4,_0,_3,_4>,_3,_3,_false>_>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0>_>
                *)this_00);
    in_stack_fffffffffffff9a0 =
         (MatrixBase<Eigen::Transpose<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_> *)in_RDI[1];
    Indices::operator[](in_stack_fffffffffffff990,(int)((ulong)in_stack_fffffffffffff988 >> 0x20));
    triangulation::triangulate2(in_stack_fffffffffffffbf8,in_stack_fffffffffffffbf0);
    Eigen::DenseBase<Eigen::Matrix<double,4,1,0,4,1>>::block<3,1>
              ((DenseBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_> *)other,
               (Index)in_stack_fffffffffffff990,(Index)in_stack_fffffffffffff988);
    Eigen::Block<Eigen::Matrix<double,4,1,0,4,1>,3,1,false>::operator=
              ((Block<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_3,_1,_false> *)in_stack_fffffffffffff988
               ,(DenseBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)this_00);
    Eigen::DenseBase<Eigen::Matrix<double,4,1,0,4,1>>::block<3,1>
              ((DenseBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_> *)other,
               (Index)in_stack_fffffffffffff990,(Index)in_stack_fffffffffffff988);
    Eigen::Matrix<double,3,1,0,3,1>::Matrix<Eigen::Block<Eigen::Matrix<double,4,1,0,4,1>,3,1,false>>
              ((Matrix<double,_3,_1,_0,_3,_1> *)in_stack_fffffffffffff988,
               (EigenBase<Eigen::Block<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_3,_1,_false>_> *)
               this_00);
    local_568 = Eigen::MatrixBase<Eigen::Matrix<double,3,4,0,3,4>>::operator*
                          ((MatrixBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_> *)
                           in_stack_fffffffffffff988,
                           (MatrixBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_> *)this_00);
    Eigen::Matrix<double,3,1,0,3,1>::
    Matrix<Eigen::Product<Eigen::Matrix<double,3,4,0,3,4>,Eigen::Matrix<double,4,1,0,4,1>,0>>
              ((Matrix<double,_3,_1,_0,_3,_1> *)in_stack_fffffffffffff988,
               (EigenBase<Eigen::Product<Eigen::Matrix<double,_3,_4,_0,_3,_4>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>,_0>_>
                *)this_00);
    local_590 = Eigen::MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>::norm
                          ((MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)this_00);
    Eigen::MatrixBase<Eigen::Matrix<double,3,1,0,3,1>>::operator/(in_stack_fffffffffffff9d0,in_RDI);
    Eigen::Matrix<double,3,1,0,3,1>::operator=
              ((Matrix<double,_3,_1,_0,_3,_1> *)in_stack_fffffffffffff988,
               (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>_>
                *)this_00);
    local_5b8 = Eigen::MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>::norm
                          ((MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)this_00);
    Eigen::MatrixBase<Eigen::Matrix<double,3,1,0,3,1>>::operator/(in_stack_fffffffffffff9d0,in_RDI);
    Eigen::Matrix<double,3,1,0,3,1>::operator=
              ((Matrix<double,_3,_1,_0,_3,_1> *)in_stack_fffffffffffff988,
               (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>_>
                *)this_00);
    in_stack_fffffffffffff9a8 = (MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)in_RDI[1];
    iVar2 = Indices::operator[](in_stack_fffffffffffff990,
                                (int)((ulong)in_stack_fffffffffffff988 >> 0x20));
    (**(code **)(*(long *)in_stack_fffffffffffff9a8 + 0x10))
              (local_5d0,in_stack_fffffffffffff9a8,(long)iVar2);
    in_stack_fffffffffffff9b0 = (MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)in_RDI[1];
    iVar2 = Indices::operator[](in_stack_fffffffffffff990,
                                (int)((ulong)in_stack_fffffffffffff988 >> 0x20));
    (**(code **)(*(long *)in_stack_fffffffffffff9b0 + 0x18))
              (local_5e8,in_stack_fffffffffffff9b0,(long)iVar2);
    Eigen::DenseBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>::transpose
              ((DenseBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)this_00);
    Eigen::MatrixBase<Eigen::Transpose<Eigen::Matrix<double,3,1,0,3,1>>>::operator*
              ((MatrixBase<Eigen::Transpose<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_> *)
               in_stack_fffffffffffff988,
               (MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)this_00);
    SVar6 = Eigen::internal::dense_product_base::operator_cast_to_double
                      ((dense_product_base<Eigen::Transpose<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_6>
                        *)other);
    Eigen::DenseBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>::transpose
              ((DenseBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)this_00);
    Eigen::MatrixBase<Eigen::Transpose<Eigen::Matrix<double,3,1,0,3,1>>>::operator*
              ((MatrixBase<Eigen::Transpose<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_> *)
               in_stack_fffffffffffff988,
               (MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)this_00);
    SVar7 = Eigen::internal::dense_product_base::operator_cast_to_double
                      ((dense_product_base<Eigen::Transpose<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_6>
                        *)other);
    in_stack_fffffffffffff9d0 =
         (MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)0x3ff0000000000000;
    pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)
                        in_stack_fffffffffffff988,(Index)this_00);
    *pSVar5 = ((1.0 - SVar6) + (1.0 - SVar7)) * 1.0;
    local_148 = local_148 + 1;
  }
  return 0;
}

Assistant:

int operator()(const VectorXd &x, VectorXd &fvec) const
  {
    assert( x.size() == 6 );
    assert( (unsigned int) fvec.size() == _indices.size());

    //compute the current position
    translation_t translation = x.block<3,1>(0,0);
    cayley_t cayley = x.block<3,1>(3,0);
    rotation_t rotation = math::cayley2rot(cayley);

    Eigen::Matrix<double,4,1> p_hom;
    p_hom[3] = 1.0;

    for( size_t i = 0; i < _indices.size(); i++ )
    {
      translation_t cam1Offset = _adapter.getCamOffset1(_indices[i]);
      rotation_t cam1Rotation = _adapter.getCamRotation1(_indices[i]);
      translation_t cam2Offset = _adapter.getCamOffset2(_indices[i]);
      rotation_t cam2Rotation = _adapter.getCamRotation2(_indices[i]);

      translation_t directTranslation =
          cam1Rotation.transpose() *
          ((translation - cam1Offset) + rotation * cam2Offset);
      rotation_t directRotation =
          cam1Rotation.transpose() * rotation * cam2Rotation;

      _adapter.sett12(directTranslation);
      _adapter.setR12(directRotation);

      transformation_t inverseSolution;
      inverseSolution.block<3,3>(0,0) = directRotation.transpose();
      inverseSolution.col(3) =
          -inverseSolution.block<3,3>(0,0)*directTranslation;

      p_hom.block<3,1>(0,0) =
          opengv::triangulation::triangulate2(_adapter,_indices[i]);
      bearingVector_t reprojection1 = p_hom.block<3,1>(0,0);
      bearingVector_t reprojection2 = inverseSolution * p_hom;
      reprojection1 = reprojection1 / reprojection1.norm();
      reprojection2 = reprojection2 / reprojection2.norm();
      bearingVector_t f1 = _adapter.getBearingVector1(_indices[i]);
      bearingVector_t f2 = _adapter.getBearingVector2(_indices[i]);

      //bearing-vector based outlier criterium (select threshold accordingly):
      //1-(f1'*f2) = 1-cos(alpha) \in [0:2]
      double reprojError1 = 1.0 - (f1.transpose() * reprojection1);
      double reprojError2 = 1.0 - (f2.transpose() * reprojection2);
      double factor = 1.0;
      fvec[i] = factor*(reprojError1 + reprojError2);
    }

    return 0;
  }